

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

void __thiscall sjtu::TrainManager::add_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  DynamicFileManager<sjtu::trainType> *pDVar2;
  char *pcVar3;
  char *pcVar4;
  TrainManager *pTVar5;
  long *__nptr;
  int iVar6;
  long *plVar7;
  undefined4 extraout_var;
  int *piVar8;
  invalid_command *this_00;
  long lVar9;
  char *pcVar10;
  undefined8 extraout_RDX;
  int iVar11;
  int iVar12;
  ulong uVar13;
  string *psVar14;
  long lVar15;
  ulong uVar16;
  pair<long,_bool> pVar17;
  string stopoverTimes;
  string travelTimes;
  string prices;
  string stations;
  string trainID;
  string saleDate;
  string startTime;
  string type;
  string seatNum;
  string stationNum;
  long *local_260 [2];
  long local_250 [2];
  char *local_240;
  long local_238;
  char *local_230;
  long *local_228 [2];
  TrainManager *local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  char *local_190;
  long local_188;
  char local_180;
  undefined7 uStack_17f;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  char *local_130;
  undefined8 local_128;
  char local_120;
  undefined7 uStack_11f;
  long *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  long *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = &local_180;
  iVar11 = 0;
  local_188 = 0;
  local_180 = '\0';
  local_f0 = (long *)&local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_110 = (long *)&local_100;
  local_108 = 0;
  local_100 = 0;
  local_1b0 = &local_1a0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_150 = &local_140;
  local_148 = 0;
  local_140 = 0;
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_210 = &local_200;
  local_208 = 0;
  local_200 = 0;
  local_170 = &local_160;
  local_168 = 0;
  local_160 = 0;
  local_130 = &local_120;
  local_128 = 0;
  local_120 = '\0';
  local_218 = this;
  if (0 < argc) {
    do {
      iVar6 = std::__cxx11::string::compare((char *)argv);
      psVar14 = (string *)&local_190;
      if ((iVar6 != 0) &&
         (iVar6 = std::__cxx11::string::compare((char *)argv), psVar14 = (string *)&local_f0,
         iVar6 != 0)) {
        iVar6 = std::__cxx11::string::compare((char *)argv);
        psVar14 = (string *)&local_110;
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)argv);
          psVar14 = (string *)&local_1b0;
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)argv);
            psVar14 = (string *)&local_1d0;
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)argv);
              psVar14 = (string *)&local_150;
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)argv);
                psVar14 = (string *)&local_1f0;
                if (iVar6 != 0) {
                  iVar6 = std::__cxx11::string::compare((char *)argv);
                  psVar14 = (string *)&local_210;
                  if (iVar6 != 0) {
                    iVar6 = std::__cxx11::string::compare((char *)argv);
                    psVar14 = (string *)&local_170;
                    if (iVar6 != 0) {
                      iVar6 = std::__cxx11::string::compare((char *)argv);
                      psVar14 = (string *)&local_130;
                      if (iVar6 != 0) goto LAB_00107919;
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::_M_assign(psVar14);
      argv = argv + 2;
      iVar11 = iVar11 + 2;
    } while (iVar11 < argc);
  }
  pTVar5 = local_218;
  pBVar1 = local_218->TrainBpTree;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_190,local_190 + local_188);
  if (local_c8 == 0) {
    local_260[0] = (long *)0x0;
  }
  else {
    lVar15 = 0;
    lVar9 = 0;
    uVar13 = 0;
    do {
      uVar16 = (ulong)((int)*(char *)((long)local_d0 + lVar15) + 0x100);
      lVar9 = (long)(lVar9 * 0x239 + uVar16) % 0x3b800001;
      uVar13 = (long)(uVar13 * 0x301 + uVar16) % 0x3b9aca07;
      lVar15 = lVar15 + 1;
    } while (local_c8 != lVar15);
    local_260[0] = (long *)(lVar9 << 0x20 | uVar13);
  }
  pVar17 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar1,(unsigned_long_long *)local_260);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
LAB_00107729:
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    if (local_110 != (long *)&local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
    if (local_f0 != (long *)&local_e0) {
      operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
    }
    return;
  }
  iVar11 = (*(pTVar5->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[1])
                     ();
  local_240 = (char *)CONCAT44(extraout_var,iVar11);
  *(undefined8 *)(local_240 + 0xa7a0) = extraout_RDX;
  local_240[0xa799] = '\0';
  strcpy(local_240,local_190);
  __nptr = local_f0;
  piVar8 = __errno_location();
  iVar11 = *piVar8;
  *piVar8 = 0;
  lVar9 = strtol((char *)__nptr,(char **)local_260,10);
  plVar7 = local_110;
  pcVar3 = local_240;
  if (local_260[0] == __nptr) goto LAB_001078e9;
  if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_001078f5;
  if (*piVar8 == 0) {
    *piVar8 = iVar11;
  }
  *(int *)(local_240 + 0x18) = (int)lVar9;
  iVar11 = *piVar8;
  *piVar8 = 0;
  lVar9 = strtol((char *)local_110,(char **)local_260,10);
  pcVar4 = local_240;
  if (local_260[0] != plVar7) {
    if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar8 != 0x22)) {
      if (*piVar8 == 0) {
        *piVar8 = iVar11;
      }
      *(int *)(pcVar3 + 0x1c) = (int)lVar9;
      if (0 < *(int *)(pcVar3 + 0x18)) {
        lVar9 = 0;
        pcVar10 = pcVar3;
        do {
          lVar15 = 0x13;
          do {
            *(undefined4 *)(pcVar10 + lVar15 * 4) = *(undefined4 *)(pcVar3 + 0x1c);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x6f);
          lVar9 = lVar9 + 1;
          pcVar10 = pcVar10 + 0x1a8;
        } while (lVar9 < *(int *)(pcVar3 + 0x18));
      }
      if (0 < *(int *)(pcVar3 + 0x18)) {
        iVar6 = (int)local_1a8;
        lVar9 = 0;
        iVar11 = 0;
        do {
          iVar12 = iVar11;
          if (iVar11 < iVar6) {
            lVar15 = 0;
            do {
              if (local_1b0[lVar15 + iVar11] == '|') {
                iVar12 = iVar11 + (int)lVar15;
                break;
              }
              lVar15 = lVar15 + 1;
              iVar12 = iVar6;
            } while ((long)iVar6 - (long)iVar11 != lVar15);
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1b0);
          strcpy(pcVar4 + lVar9 * 0x1a8 + 0x20,(char *)local_260[0]);
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          lVar9 = lVar9 + 1;
          iVar11 = iVar12 + 1;
        } while (lVar9 < *(int *)(pcVar3 + 0x18));
      }
      if (1 < *(int *)(pcVar3 + 0x18)) {
        local_230 = local_240 + 0x20;
        iVar11 = (int)local_1c8;
        local_238 = (long)iVar11;
        iVar6 = 0;
        lVar9 = 1;
        do {
          iVar12 = iVar6;
          if (iVar6 < iVar11) {
            lVar15 = 0;
            do {
              if (local_1d0[lVar15 + iVar6] == '|') {
                iVar12 = iVar6 + (int)lVar15;
                break;
              }
              lVar15 = lVar15 + 1;
              iVar12 = iVar11;
            } while (local_238 - iVar6 != lVar15);
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1d0);
          plVar7 = local_260[0];
          iVar6 = *piVar8;
          *piVar8 = 0;
          lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
          if (local_228[0] == plVar7) {
            std::__throw_invalid_argument("stoi");
LAB_001078ad:
            std::__throw_out_of_range("stoi");
            goto LAB_001078b9;
          }
          if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_001078ad;
          if (*piVar8 == 0) {
            *piVar8 = iVar6;
          }
          *(int *)(local_230 + lVar9 * 0x1a8 + 0x19c) = (int)lVar15;
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          lVar9 = lVar9 + 1;
          iVar6 = iVar12 + 1;
        } while (lVar9 < *(int *)(pcVar3 + 0x18));
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_150,local_150 + local_148)
      ;
      timeType::timeType((timeType *)local_260,&local_90);
      *(long **)(pcVar3 + 0xa788) = local_260[0];
      *(long **)(pcVar3 + 0xa790) = local_260[1];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (1 < *(int *)(pcVar3 + 0x18)) {
        local_230 = local_240 + 0x20;
        iVar11 = (int)local_1e8;
        local_238 = (long)iVar11;
        iVar6 = 0;
        lVar9 = 1;
        do {
          iVar12 = iVar6;
          if (iVar6 < iVar11) {
            lVar15 = 0;
            do {
              if (local_1f0[lVar15 + iVar6] == '|') {
                iVar12 = iVar6 + (int)lVar15;
                break;
              }
              lVar15 = lVar15 + 1;
              iVar12 = iVar11;
            } while (local_238 - iVar6 != lVar15);
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1f0);
          plVar7 = local_260[0];
          iVar6 = *piVar8;
          *piVar8 = 0;
          lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
          if (local_228[0] == plVar7) goto LAB_001078b9;
          if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_001078c5;
          if (*piVar8 == 0) {
            *piVar8 = iVar6;
          }
          *(int *)(local_230 + lVar9 * 0x1a8 + 0x1a4) = (int)lVar15;
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          lVar9 = lVar9 + 1;
          iVar6 = iVar12 + 1;
        } while (lVar9 < *(int *)(pcVar3 + 0x18));
      }
      if (2 < *(int *)(pcVar3 + 0x18)) {
        local_230 = local_240 + 0x20;
        iVar11 = (int)local_208;
        local_238 = (long)iVar11;
        iVar6 = 0;
        lVar9 = 1;
        do {
          iVar12 = iVar6;
          if (iVar6 < iVar11) {
            lVar15 = 0;
            do {
              if (local_210[lVar15 + iVar6] == '|') {
                iVar12 = iVar6 + (int)lVar15;
                break;
              }
              lVar15 = lVar15 + 1;
              iVar12 = iVar11;
            } while (local_238 - iVar6 != lVar15);
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_210);
          plVar7 = local_260[0];
          iVar6 = *piVar8;
          *piVar8 = 0;
          lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
          if (local_228[0] == plVar7) goto LAB_001078d1;
          if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_001078dd;
          if (*piVar8 == 0) {
            *piVar8 = iVar6;
          }
          *(int *)(local_230 + lVar9 * 0x1a8 + 0x1a0) = (int)lVar15;
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          lVar9 = lVar9 + 1;
          iVar6 = iVar12 + 1;
        } while (lVar9 < (long)*(int *)(pcVar3 + 0x18) + -1);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_170);
      timeType::timeType((timeType *)local_260,&local_50);
      pTVar5 = local_218;
      pcVar4 = local_240;
      *(long **)(pcVar3 + 0xa768) = local_260[0];
      *(long **)(pcVar3 + 0xa770) = local_260[1];
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_170);
      timeType::timeType((timeType *)local_228,&local_70);
      *(long **)(pcVar3 + 0xa778) = local_228[0];
      *(long **)(pcVar3 + 0xa780) = local_228[1];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar3[0xa798] = *local_130;
      pDVar2 = pTVar5->TrainFile;
      (*(pDVar2->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
                (pDVar2,pcVar4 + 0xa7a0);
      pBVar1 = pTVar5->TrainBpTree;
      std::__cxx11::string::string((string *)&local_b0,pcVar3,(allocator *)local_228);
      if (local_a8 == 0) {
        local_260[0] = (long *)0x0;
      }
      else {
        lVar15 = 0;
        lVar9 = 0;
        uVar13 = 0;
        do {
          uVar16 = (ulong)((int)*(char *)((long)local_b0 + lVar15) + 0x100);
          lVar9 = (long)(lVar9 * 0x239 + uVar16) % 0x3b800001;
          uVar13 = (long)(uVar13 * 0x301 + uVar16) % 0x3b9aca07;
          lVar15 = lVar15 + 1;
        } while (local_a8 != lVar15);
        local_260[0] = (long *)(lVar9 << 0x20 | uVar13);
      }
      local_260[1] = *(long **)(pcVar4 + 0xa7a0);
      BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                (pBVar1,(value_type *)local_260);
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      goto LAB_00107729;
    }
    goto LAB_0010790d;
  }
  goto LAB_00107901;
LAB_001078b9:
  std::__throw_invalid_argument("stoi");
LAB_001078c5:
  std::__throw_out_of_range("stoi");
LAB_001078d1:
  std::__throw_invalid_argument("stoi");
LAB_001078dd:
  std::__throw_out_of_range("stoi");
LAB_001078e9:
  std::__throw_invalid_argument("stoi");
LAB_001078f5:
  std::__throw_out_of_range("stoi");
LAB_00107901:
  std::__throw_invalid_argument("stoi");
LAB_0010790d:
  std::__throw_out_of_range("stoi");
LAB_00107919:
  this_00 = (invalid_command *)__cxa_allocate_exception(0x68);
  invalid_command::invalid_command(this_00);
  __cxa_throw(this_00,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void add_train(int argc , std::string *argv)
		{
			std::string trainID , stationNum , seatNum , stations , prices , startTime , travelTimes , stopoverTimes , saleDate , type;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-n") stationNum = argv[i + 1];
				else if (argv[i] == "-m") seatNum = argv[i + 1];
				else if (argv[i] == "-s") stations = argv[i + 1];
				else if (argv[i] == "-p") prices = argv[i + 1];
				else if (argv[i] == "-x") startTime = argv[i + 1];
				else if (argv[i] == "-t") travelTimes = argv[i + 1];
				else if (argv[i] == "-o") stopoverTimes = argv[i + 1];
				else if (argv[i] == "-d") saleDate = argv[i + 1];
				else if (argv[i] == "-y") type = argv[i + 1];
				else throw invalid_command();
			if (TrainBpTree -> find(hasher(trainID)).second) std::cout << -1 << std::endl;
			else
			{
				auto ret = TrainFile -> newspace();
				trainType *train = ret.first;
				train -> offset = ret.second , train -> is_released = false;
				strcpy(train -> trainID , trainID.c_str());
				train -> stationNum = stoi(stationNum) , train -> seatNum = stoi(seatNum);
				for (int i = 0;i < train -> stationNum;++ i)
					for (int j = 0;j < 92;++ j)
						train -> stations[i].seatNum[j] = train -> seatNum;
				for (int i = 0 , l = 0 , r , len = stations.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && stations[r] != '|';++ r);
					strcpy(train -> stations[i].stationName , stations.substr(l , r - l).c_str());
				}
				for (int i = 1 , l = 0 , r , len = prices.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && prices[r] != '|';++ r);
					train -> stations[i].price = stoi(prices.substr(l , r - l));
				}
				train -> startTime = timeType(startTime);
				for (int i = 1 , l = 0 , r , len = travelTimes.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && travelTimes[r] != '|';++ r);
					train -> stations[i].travelTime = stoi(travelTimes.substr(l , r - l));
				}
				for (int i = 1 , l = 0 , r , len = stopoverTimes.size();i < train -> stationNum - 1;++ i , l = r + 1)
				{
					for (r = l;r < len && stopoverTimes[r] != '|';++ r);
					train -> stations[i].stopoverTime = stoi(stopoverTimes.substr(l , r - l));
				}
				train -> saleDate[0] = timeType(saleDate.substr(0 , 5)) , train -> saleDate[1] = timeType(saleDate.substr(6 , 5));
				train -> type = type[0];
				TrainFile -> save(train -> offset) , TrainBpTree -> insert(std::make_pair(hasher(train -> trainID) , train -> offset));
				std::cout << 0 << std::endl;
			}
		}